

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastSet.h
# Opt level: O0

CFastSet<int> * __thiscall CFastSet<int>::operator=(CFastSet<int> *this,CFastSet<int> *set)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int *piVar3;
  int local_1c;
  int i;
  CFastSet<int> *set_local;
  CFastSet<int> *this_local;
  
  if (this != set) {
    if (this->elementsSize != set->elementsSize) {
      if (this->elements != (int *)0x0) {
        operator_delete__(this->elements);
      }
      this->elementsSize = set->elementsSize;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)this->elementsSize;
      uVar2 = SUB168(auVar1 * ZEXT816(4),0);
      if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      piVar3 = (int *)operator_new__(uVar2);
      this->elements = piVar3;
    }
    for (local_1c = 0; local_1c < this->elementsSize; local_1c = local_1c + 1) {
      this->elements[local_1c] = set->elements[local_1c];
    }
  }
  return this;
}

Assistant:

CFastSet<T>& CFastSet<T>::operator=( const CFastSet& set )
{
	if( this != &set ) {
		if( elementsSize != set.elementsSize ) {
			delete[] elements;
			elementsSize = set.elementsSize;
			elements = new T[elementsSize];
		}
		for( int i = 0; i < elementsSize; i++ ) {
			elements[i] = set.elements[i];
		}
	}
	return *this;
}